

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode,
          bool build_it)

{
  pointer pcVar1;
  uint uVar2;
  Symbol SVar3;
  long lVar4;
  string *psVar5;
  undefined8 uVar6;
  string scope_to_try;
  string first_part_of_name;
  string local_80;
  ResolveMode local_5c;
  string local_58;
  string *local_38;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->undefine_resolved_name_)._M_string_length = 0;
  *(this->undefine_resolved_name_)._M_dataplus._M_p = '\0';
  local_5c = resolve_mode;
  if ((name->_M_string_length == 0) || (*(name->_M_dataplus)._M_p != '.')) {
    lVar4 = std::__cxx11::string::find((char)name,0x2e);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    if (lVar4 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_58);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)name);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    pcVar1 = (relative_to->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + relative_to->_M_string_length);
    psVar5 = (string *)std::__cxx11::string::rfind((char)&local_80,0x2e);
    if (psVar5 != (string *)0xffffffffffffffff) {
      local_38 = (string *)&this->undefine_resolved_name_;
      do {
        if (local_80._M_string_length < psVar5) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     psVar5);
LAB_00350e9d:
          uVar6 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase",relative_to);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          _Unwind_Resume(uVar6);
        }
        local_80._M_dataplus._M_p[(long)psVar5] = '\0';
        local_80._M_string_length = (size_type)psVar5;
        std::__cxx11::string::_M_replace_aux((ulong)&local_80,(ulong)psVar5,0,'\x01');
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_58._M_dataplus._M_p);
        SVar3 = FindSymbol(this,&local_80,build_it);
        if ((SVar3.ptr_ != (SymbolBase *)0x0) && ((SVar3.ptr_)->symbol_type_ != 0)) {
          uVar2 = (uint)(SVar3.ptr_)->symbol_type_;
          if (local_58._M_string_length < name->_M_string_length) {
            if ((uVar2 < 10) && ((0x292U >> (uVar2 & 0x1f) & 1) != 0)) {
              std::__cxx11::string::append
                        ((string *)&local_80,(ulong)name,local_58._M_string_length);
              SVar3 = FindSymbol(this,&local_80,build_it);
              if ((SVar3.ptr_ == (SymbolBase *)0x0) || ((SVar3.ptr_)->symbol_type_ == '\0')) {
                std::__cxx11::string::_M_assign(local_38);
              }
              goto LAB_00350e0f;
            }
          }
          else if (((local_5c != LOOKUP_TYPES) || (uVar2 == 1)) || (uVar2 == 4)) goto LAB_00350e0f;
        }
        relative_to = psVar5;
        if (local_80._M_string_length < psVar5) goto LAB_00350e9d;
        local_80._M_dataplus._M_p[(long)psVar5] = '\0';
        local_80._M_string_length = (size_type)psVar5;
        psVar5 = (string *)std::__cxx11::string::rfind((char)&local_80,0x2e);
      } while (psVar5 != (string *)0xffffffffffffffff);
    }
    SVar3 = FindSymbol(this,name,build_it);
LAB_00350e0f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)name);
    SVar3 = FindSymbol(this,&local_58,build_it);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (Symbol)SVar3.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const std::string& name, const std::string& relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  std::string first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}